

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_serialize_to_file_pretty(JSON_Value *value,char *filename)

{
  int iVar1;
  int iVar2;
  char *__s;
  FILE *__stream;
  JSON_Status JVar3;
  
  __s = json_serialize_to_string_pretty(value);
  if (__s == (char *)0x0) {
    JVar3 = -1;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      JVar3 = -1;
    }
    else {
      iVar1 = fputs(__s,__stream);
      iVar2 = fclose(__stream);
      JVar3 = -(uint)(iVar2 == -1 || iVar1 == -1);
    }
    (*parson_free)(__s);
  }
  return JVar3;
}

Assistant:

JSON_Status json_serialize_to_file_pretty(const JSON_Value *value, const char *filename) {
    JSON_Status return_code = JSONSuccess;
    FILE *fp = NULL;
    char *serialized_string = json_serialize_to_string_pretty(value);
    if (serialized_string == NULL) {
        return JSONFailure;
    }
    fp = fopen(filename, "w");
    if (fp == NULL) {
        json_free_serialized_string(serialized_string);
        return JSONFailure;
    }
    if (fputs(serialized_string, fp) == EOF) {
        return_code = JSONFailure;
    }
    if (fclose(fp) == EOF) {
        return_code = JSONFailure;
    }
    json_free_serialized_string(serialized_string);
    return return_code;
}